

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.h
# Opt level: O0

void __thiscall Threadpool<Searchthread>::~Threadpool(Threadpool<Searchthread> *this)

{
  bool bVar1;
  int in_ESI;
  Threadpool<Searchthread> *this_local;
  
  bVar1 = std::atomic::operator_cast_to_bool((atomic *)&this->stop);
  if (!bVar1) {
    exit(this,in_ESI);
  }
  std::condition_variable::~condition_variable(&this->cv_finished);
  std::condition_variable::~condition_variable(&this->cv_task);
  std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~deque(&this->tasks)
  ;
  std::vector<Searchthread_*,_std::allocator<Searchthread_*>_>::~vector(&this->workers);
  return;
}

Assistant:

~Threadpool() { if (!stop) exit(); }